

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colors.cpp
# Opt level: O2

void Colors::outputColorCode(ostream *stream,char *colorCode)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  if (outputColorCode(std::ostream&,char_const*)::has_color == '\0') {
    iVar2 = __cxa_guard_acquire(&outputColorCode(std::ostream&,char_const*)::has_color);
    if (iVar2 != 0) {
      pcVar3 = getenv("COLORS");
      if ((pcVar3 == (char *)0x0) || (bVar1 = true, *pcVar3 != '1')) {
        iVar2 = isatty(1);
        if (iVar2 == 0) {
          bVar1 = false;
        }
        else {
          pcVar3 = getenv("COLORS");
          if (pcVar3 == (char *)0x0) {
            bVar1 = true;
          }
          else {
            bVar1 = *pcVar3 != '0';
          }
        }
      }
      outputColorCode::has_color = bVar1;
      __cxa_guard_release(&outputColorCode(std::ostream&,char_const*)::has_color);
    }
  }
  if ((outputColorCode::has_color == true) && (::(anonymous_namespace)::colors_enabled == '\x01')) {
    std::operator<<(stream,colorCode);
    return;
  }
  return;
}

Assistant:

void Colors::outputColorCode(std::ostream& stream, const char* colorCode) {
  const static bool has_color = []() {
    return (getenv("COLORS") && getenv("COLORS")[0] == '1') || // forced
           (isatty(STDOUT_FILENO) &&
            (!getenv("COLORS") || getenv("COLORS")[0] != '0')); // implicit
  }();
  if (has_color && colors_enabled) {
    stream << colorCode;
  }
}